

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QString * toStringTextDate(QString *__return_storage_ptr__,QDate date)

{
  long lVar1;
  int day;
  QDate QVar2;
  QLocale *this;
  long in_FS_OFFSET;
  YearMonthDay YVar3;
  QArrayDataPointer<char16_t> QStack_198;
  QLocale local_180;
  QArrayDataPointer<char16_t> local_178;
  QLocale local_160;
  QArrayDataPointer<char16_t> local_158;
  QStringBuilder<QString,_const_QLatin1Char_&> local_138;
  QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> local_118;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>
  local_e0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
  local_a0;
  QLatin1Char local_41;
  QCalendar cal;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
    cal.d_ptr = (QCalendarBackend *)&DAT_aaaaaaaaaaaaaaaa;
    QCalendar::QCalendar(&cal);
    QVar2.jd = date.jd;
    YVar3 = QCalendar::partsFromDate(&cal,date);
    if (YVar3._0_8_ >> 0x20 != 0x80000000) {
      local_41.ch = ' ';
      QLocale::c(&local_160,(void *)QVar2.jd);
      day = QCalendar::dayOfWeek(&cal,date);
      this = &local_160;
      QLocale::dayName((QString *)&local_158,this,day,ShortFormat);
      local_138.a.d.size = local_158.size;
      local_138.a.d.ptr = local_158.ptr;
      local_138.a.d.d = local_158.d;
      local_158.d = (Data *)0x0;
      local_158.ptr = (char16_t *)0x0;
      local_158.size = 0;
      local_138.b = &local_41;
      QLocale::c(&local_180,this);
      QCalendar::monthName((QString *)&local_178,&cal,&local_180,YVar3.month,YVar3.year,ShortFormat)
      ;
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::QStringBuilder
                (&local_118,&local_138,(QString *)&local_178);
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::QStringBuilder
                (&local_e0.a,&local_118);
      local_e0.b = &local_41;
      QString::asprintf((char **)&QStack_198,"%d %04d",(ulong)(uint)YVar3.day,
                        YVar3._0_8_ & 0xffffffff);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::QStringBuilder(&local_a0,&local_e0,(QString *)&QStack_198);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::convertTo<QString>(__return_storage_ptr__,&local_a0);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::~QStringBuilder(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_198);
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
                (&local_e0.a);
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
                (&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
      QLocale::~QLocale(&local_180);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      QLocale::~QLocale(&local_160);
      goto LAB_0030bd55;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0030bd55:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString toStringTextDate(QDate date)
{
    if (date.isValid()) {
        QCalendar cal; // Always Gregorian
        const auto parts = cal.partsFromDate(date);
        if (parts.isValid()) {
            const QLatin1Char sp(' ');
            return QLocale::c().dayName(cal.dayOfWeek(date), QLocale::ShortFormat) + sp
                + cal.monthName(QLocale::c(), parts.month, parts.year, QLocale::ShortFormat)
                // Documented to use 4-digit year
                + sp + QString::asprintf("%d %04d", parts.day, parts.year);
        }
    }
    return QString();
}